

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_ldst_fp(DisasContext_conflict2 *s,int opsize,TCGv_i32 addr,TCGv_ptr fp,ea_what what,
                int index)

{
  TCGContext_conflict2 *s_00;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_15;
  uintptr_t o_4;
  uintptr_t o_3;
  
  s_00 = s->uc->tcg_ctx;
  tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I64,false);
  tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  if (what != EA_STORE) {
    (*(code *)(&DAT_00d7e388 + *(int *)(&DAT_00d7e388 + (ulong)(uint)opsize * 4)))();
    return;
  }
  (*(code *)(&DAT_00d7e3a4 + *(int *)(&DAT_00d7e3a4 + (ulong)(uint)opsize * 4)))();
  return;
}

Assistant:

static void gen_ldst_fp(DisasContext *s, int opsize, TCGv addr,
                        TCGv_ptr fp, ea_what what, int index)
{
    if (what == EA_STORE) {
        gen_store_fp(s, opsize, addr, fp, index);
    } else {
        gen_load_fp(s, opsize, addr, fp, index);
    }
}